

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArHosekSkyModel.c
# Opt level: O0

ArHosekSkyModelState *
arhosekskymodelstate_alloc_init
          (double solar_elevation,double atmospheric_turbidity,double ground_albedo)

{
  ArHosekSkyModelState *pAVar1;
  double in_XMM0_Qa;
  double dVar2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  uint wl;
  ArHosekSkyModelState *state;
  double in_stack_00000130;
  double in_stack_00000138;
  double in_stack_00000140;
  ArHosekSkyModel_Radiance_Dataset in_stack_00000148;
  ArHosekSkyModel_Dataset in_stack_00000150;
  uint local_24;
  
  pAVar1 = (ArHosekSkyModelState *)malloc(0x440);
  pAVar1->solar_radius = 0.00445058959258554;
  pAVar1->turbidity = in_XMM1_Qa;
  pAVar1->albedo = in_XMM2_Qa;
  pAVar1->elevation = in_XMM0_Qa;
  for (local_24 = 0; local_24 < 0xb; local_24 = local_24 + 1) {
    ArHosekSkyModel_CookConfiguration
              (in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138,
               in_stack_00000130);
    dVar2 = ArHosekSkyModel_CookRadianceConfiguration
                      (in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130);
    pAVar1->radiances[local_24] = dVar2;
    pAVar1->emission_correction_factor_sun[local_24] = 1.0;
    pAVar1->emission_correction_factor_sky[local_24] = 1.0;
  }
  return pAVar1;
}

Assistant:

ArHosekSkyModelState  * arhosekskymodelstate_alloc_init(
        const double  solar_elevation,
        const double  atmospheric_turbidity,
        const double  ground_albedo
        )
{
    ArHosekSkyModelState  * state = ALLOC(ArHosekSkyModelState);

    state->solar_radius = ( 0.51 DEGREES ) / 2.0;
    state->turbidity    = atmospheric_turbidity;
    state->albedo       = ground_albedo;
    state->elevation    = solar_elevation;

    unsigned int wl;
    for( wl = 0; wl < 11; ++wl )
    {
        ArHosekSkyModel_CookConfiguration(
            datasets[wl], 
            state->configs[wl], 
            atmospheric_turbidity, 
            ground_albedo, 
            solar_elevation
            );

        state->radiances[wl] = 
            ArHosekSkyModel_CookRadianceConfiguration(
                datasetsRad[wl],
                atmospheric_turbidity,
                ground_albedo,
                solar_elevation
                );

        state->emission_correction_factor_sun[wl] = 1.0;
        state->emission_correction_factor_sky[wl] = 1.0;
    }

    return state;
}